

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.h
# Opt level: O1

Value * __thiscall
soul::Value::castToTypeWithError<soul::CodeLocation&>
          (Value *__return_storage_ptr__,Value *this,Type *destType,CodeLocation *errorLocation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CompileMessage errorMessage;
  CompileMessage local_88;
  CompileMessage local_50;
  
  paVar1 = &local_88.description.field_2;
  local_88.description._M_string_length = 0;
  local_88.description.field_2._M_local_buf[0] = '\0';
  local_88.location.sourceCode.object = (SourceCodeText *)0x0;
  local_88.location.location.data = (char *)0x0;
  local_88.type = error;
  local_88.category = none;
  local_88.description._M_dataplus._M_p = (pointer)paVar1;
  tryCastToType(__return_storage_ptr__,this,destType,&local_88);
  if ((__return_storage_ptr__->type).category != invalid) {
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_88.description._M_dataplus._M_p,
                      CONCAT71(local_88.description.field_2._M_allocated_capacity._1_7_,
                               local_88.description.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
  CompileMessage::CompileMessage(&local_50,&local_88);
  CodeLocation::throwError(errorLocation,&local_50);
}

Assistant:

Value castToTypeWithError (const Type& destType, Thrower&& errorLocation) const
    {
        CompileMessage errorMessage;
        auto result = tryCastToType (destType, errorMessage);

        if (! result.isValid())
            errorLocation.throwError (errorMessage);

        return result;
    }